

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkExploreMem_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vCollect,int nFrames)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  int local_28;
  int iFanin;
  int k;
  int nFrames_local;
  Vec_Int_t *vCollect_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  if ((*(ushort *)pObj >> 7 & 1) != 0) {
    iVar1 = Wlc_ObjType(pObj);
    if ((iVar1 == 1) || ((iVar1 = Wlc_ObjType(pObj), iVar1 == 3 && (nFrames == 0)))) {
      iVar1 = Wlc_ObjId(p,pObj);
      Vec_IntPushUnique(vCollect,iVar1);
    }
    else {
      iVar1 = Wlc_ObjType(pObj);
      if (iVar1 == 3) {
        pWVar2 = Wlc_ObjFo2Fi(p,pObj);
        Wlc_NtkExploreMem_rec(p,pWVar2,vCollect,nFrames + -1);
      }
      else {
        for (local_28 = 0; iVar1 = Wlc_ObjFaninNum(pObj), local_28 < iVar1; local_28 = local_28 + 1)
        {
          iVar1 = Wlc_ObjFaninId(pObj,local_28);
          pWVar2 = Wlc_NtkObj(p,iVar1);
          Wlc_NtkExploreMem_rec(p,pWVar2,vCollect,nFrames);
        }
      }
    }
  }
  return;
}

Assistant:

void Wlc_NtkExploreMem_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vCollect, int nFrames )
{
    int k, iFanin;
    if ( pObj->Mark == 0 )
        return;
    if ( Wlc_ObjType(pObj) == WLC_OBJ_PI || (Wlc_ObjType(pObj) == WLC_OBJ_FO && nFrames == 0) )
    {
        Vec_IntPushUnique( vCollect, Wlc_ObjId(p, pObj) );
        return;
    }
    if ( Wlc_ObjType(pObj) == WLC_OBJ_FO )
    {
        Wlc_NtkExploreMem_rec( p, Wlc_ObjFo2Fi(p, pObj), vCollect, nFrames-1 );
        return;
    }
    Wlc_ObjForEachFanin( pObj, iFanin, k )
        Wlc_NtkExploreMem_rec( p, Wlc_NtkObj(p, iFanin), vCollect, nFrames );
}